

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_fill_val
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  ulong uVar2;
  unsigned_long uVar3;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  long fill_val;
  unsigned_long cnt;
  unsigned_long idx;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  vm_val_t *in_stack_ffffffffffffff88;
  uint local_64;
  unsigned_long local_50;
  ulong uVar4;
  unsigned_long in_stack_ffffffffffffffc0;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (in_RCX == (uint *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = *in_RCX;
  }
  if ((getp_fill_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_fill_val(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_fill_val::desc,1,2);
    __cxa_guard_release(&getp_fill_val(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if ((iVar1 < 0) || (0xff < iVar1)) {
      err_throw(0);
    }
    if (local_64 < 2) {
      uVar4 = 1;
    }
    else {
      iVar1 = CVmBif::pop_int_val();
      uVar2 = (ulong)iVar1;
      if (uVar2 == 0) {
        uVar4 = 1;
      }
      else {
        uVar4 = uVar2;
        uVar3 = get_element_count((CVmObjByteArray *)0x3175f4);
        if (uVar3 + 1 < uVar2) {
          uVar3 = get_element_count((CVmObjByteArray *)0x31760f);
          uVar4 = uVar3 + 1;
        }
      }
    }
    if (local_64 < 3) {
      local_50 = get_element_count((CVmObjByteArray *)0x317644);
    }
    else {
      iVar1 = CVmBif::pop_int_val();
      local_50 = (unsigned_long)iVar1;
    }
    uVar2 = uVar4;
    uVar3 = get_element_count((CVmObjByteArray *)0x31765d);
    if (uVar4 <= uVar3) {
      uVar4 = (uVar2 + local_50) - 1;
      uVar3 = get_element_count((CVmObjByteArray *)0x317692);
      if (uVar3 < uVar4) {
        get_element_count((CVmObjByteArray *)0x3176a9);
      }
    }
    save_undo((CVmObjByteArray *)CONCAT44(local_64,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,uVar2);
    fill_with((CVmObjByteArray *)CONCAT44(local_64,in_stack_ffffffffffffffd0),
              (uchar)(in_stack_ffffffffffffffcc >> 0x18),in_stack_ffffffffffffffc0,uVar2);
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_fill_val(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *in_argc)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 2);
    unsigned long idx;
    unsigned long cnt;
    long fill_val;

    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the value with which to fill elements */
    fill_val = CVmBif::pop_int_val(vmg0_);
    if (fill_val < 0 || fill_val > 255)
        err_throw(VMERR_OUT_OF_RANGE);

    /* get the starting index, if provided */
    if (argc >= 2)
    {
        /* get the index */
        idx = CVmBif::pop_int_val(vmg0_);

        /* force it to be in range */
        if (idx < 1)
            idx = 1;
        else if (idx > get_element_count() + 1)
            idx = get_element_count() + 1;
    }
    else
    {
        /* fill from the first element */
        idx = 1;
    }

    /* get the count, if provided */
    if (argc >= 3)
    {
        /* get the count */
        cnt = CVmBif::pop_int_val(vmg0_);
    }
    else
    {
        /* fill the entire array */
        cnt = get_element_count();
    }

    /* force the length to be in range */
    if (idx > get_element_count())
        cnt = 0;
    else if (idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - idx;

    /* save undo for the change */
    save_undo(vmg_ self, idx, cnt);

    /* fill with the given value */
    fill_with((unsigned char)fill_val, idx, cnt);

    /* the result is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}